

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack1_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (*in & 1) + base;
  out[1] = base + ((*in >> 1 & 1) != 0);
  out[2] = base + ((*in >> 2 & 1) != 0);
  out[3] = base + ((*in >> 3 & 1) != 0);
  out[4] = base + ((*in >> 4 & 1) != 0);
  out[5] = base + ((*in >> 5 & 1) != 0);
  out[6] = base + ((*in >> 6 & 1) != 0);
  out[7] = base + ((*in >> 7 & 1) != 0);
  return in + 1;
}

Assistant:

uint32_t * unpack1_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   & 1  ;
    *out += base;
    out++;

    return in + 1;
}